

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

UnicodeString * __thiscall icu_63::ICULocaleService::validateFallbackLocale(ICULocaleService *this)

{
  UBool UVar1;
  Locale *this_00;
  Mutex mutex;
  Mutex local_20;
  
  this_00 = Locale::getDefault();
  local_20.fMutex = (UMutex *)llock;
  umtx_lock_63((UMutex *)llock);
  UVar1 = Locale::operator!=(this_00,&this->fallbackLocale);
  if (UVar1 != '\0') {
    Locale::operator=(&this->fallbackLocale,this_00);
    LocaleUtility::initNameFromLocale(this_00,&this->fallbackLocaleName);
    ICUService::clearServiceCache(&this->super_ICUService);
  }
  Mutex::~Mutex(&local_20);
  return &this->fallbackLocaleName;
}

Assistant:

const UnicodeString&
ICULocaleService::validateFallbackLocale() const
{
    const Locale&     loc    = Locale::getDefault();
    ICULocaleService* ncThis = (ICULocaleService*)this;
    {
        Mutex mutex(&llock);
        if (loc != fallbackLocale) {
            ncThis->fallbackLocale = loc;
            LocaleUtility::initNameFromLocale(loc, ncThis->fallbackLocaleName);
            ncThis->clearServiceCache();
        }
    }
    return fallbackLocaleName;
}